

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circuit.cpp
# Opt level: O1

int scroll_width_proc(Am_Object *self)

{
  int iVar1;
  int iVar2;
  Am_Value *pAVar3;
  Am_Object local_20;
  
  Am_Object::Get_Object((ushort)&local_20,(ulong)self);
  pAVar3 = (Am_Value *)Am_Object::Get((ushort)&local_20,0x66);
  iVar1 = Am_Value::operator_cast_to_int(pAVar3);
  pAVar3 = (Am_Value *)Am_Object::Get((ushort)self,100);
  iVar2 = Am_Value::operator_cast_to_int(pAVar3);
  Am_Object::~Am_Object(&local_20);
  return (iVar1 - iVar2) + -5;
}

Assistant:

Am_Define_Formula(int, scroll_width) {
  return (int)self.Get_Owner().Get(Am_WIDTH) - 5 - (int)self.Get(Am_LEFT);
}